

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Status.hpp
# Opt level: O1

bool __thiscall InstructionSet::M68k::Status::set_status(Status *this,uint16_t status)

{
  bool bVar1;
  
  this->carry_flag = (ulong)(status & 1);
  this->overflow_flag = (ulong)(status & 2);
  this->zero_result = (ulong)(~(uint)status & 4);
  this->negative_flag = (ulong)(status & 8);
  this->extend_flag = (ulong)(status & 0x10);
  this->interrupt_level = (status & 0x700) >> 8;
  this->trace_flag = (ulong)(status & 0x8000);
  bVar1 = (bool)((byte)(status >> 0xd) & 1);
  this->is_supervisor = bVar1;
  return bVar1;
}

Assistant:

constexpr bool set_status(uint16_t status) {
		set_ccr(status);

		interrupt_level	= (status >> 8) & 7;
		trace_flag		= status & ConditionCode::Trace;
		is_supervisor	= status & ConditionCode::Supervisor;

		return is_supervisor;
	}